

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

Promise<void> __thiscall
kj::anon_unknown_36::HttpClientAdapter::DelayedCloseWebSocket::pumpTo
          (DelayedCloseWebSocket *this,WebSocket *other)

{
  Coroutine<void> *this_00;
  Promise<void> *promise;
  PromiseAwaiter<void> *pPVar1;
  DelayedCloseWebSocket *this_01;
  PromiseArenaMember *pPVar2;
  SourceLocation location;
  bool bVar3;
  coroutine_handle<void> coroutine;
  undefined8 in_RDX;
  
  coroutine._M_fr_ptr = operator_new(0x5c8);
  *(code **)coroutine._M_fr_ptr = pumpTo;
  *(code **)((long)coroutine._M_fr_ptr + 8) = pumpTo;
  this_00 = (Coroutine<void> *)((long)coroutine._M_fr_ptr + 0x10);
  *(WebSocket **)((long)coroutine._M_fr_ptr + 0x5b8) = other;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x10) = &PTR_destroy_006bc5d0;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x20) = &PTR_traceEvent_006bc618;
  location.function = "pumpTo";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  location.lineNumber = 0x1b40;
  location.columnNumber = 0x17;
  kj::_::CoroutineBase::CoroutineBase
            ((CoroutineBase *)this_00,coroutine,
             (ExceptionOrValue *)((long)coroutine._M_fr_ptr + 0x98),location);
  promise = (Promise<void> *)((long)coroutine._M_fr_ptr + 0x5a8);
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x10) = &PTR_destroy_006bc5d0;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x20) = &PTR_traceEvent_006bc618;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x98) = 0;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x230) = 0;
  (this->super_WebSocket)._vptr_WebSocket = (_func_int **)this_00;
  (**(code **)(*other[2]._vptr_WebSocket + 0x38))(promise,other[2]._vptr_WebSocket,in_RDX);
  pPVar1 = (PromiseAwaiter<void> *)((long)coroutine._M_fr_ptr + 0x238);
  co_await<void>(pPVar1,promise);
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x5c0) = 0;
  bVar3 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                    ((PromiseAwaiterBase *)pPVar1,(CoroutineBase *)this_00);
  if (!bVar3) {
    kj::_::PromiseAwaiter<void>::await_resume(pPVar1);
    if (*(char *)((long)coroutine._M_fr_ptr + 0x250) == '\x01') {
      Exception::~Exception((Exception *)((long)coroutine._M_fr_ptr + 600));
    }
    kj::_::PromiseAwaiterBase::~PromiseAwaiterBase((PromiseAwaiterBase *)pPVar1);
    pPVar2 = &((promise->super_PromiseBase).node.ptr)->super_PromiseArenaMember;
    if (pPVar2 != (PromiseArenaMember *)0x0) {
      (promise->super_PromiseBase).node.ptr = (PromiseNode *)0x0;
      kj::_::PromiseDisposer::dispose(pPVar2);
    }
    this_01 = (DelayedCloseWebSocket *)((long)coroutine._M_fr_ptr + 0x5b0);
    afterReceiveClosed(this_01);
    pPVar1 = (PromiseAwaiter<void> *)((long)coroutine._M_fr_ptr + 0x3f0);
    co_await<void>(pPVar1,(Promise<void> *)this_01);
    *(undefined1 *)((long)coroutine._M_fr_ptr + 0x5c0) = 1;
    bVar3 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                      ((PromiseAwaiterBase *)pPVar1,(CoroutineBase *)this_00);
    if (!bVar3) {
      kj::_::PromiseAwaiter<void>::await_resume(pPVar1);
      if (*(char *)((long)coroutine._M_fr_ptr + 0x408) == '\x01') {
        Exception::~Exception((Exception *)((long)coroutine._M_fr_ptr + 0x410));
      }
      kj::_::PromiseAwaiterBase::~PromiseAwaiterBase((PromiseAwaiterBase *)pPVar1);
      pPVar2 = (PromiseArenaMember *)(this_01->super_WebSocket)._vptr_WebSocket;
      if (pPVar2 != (PromiseArenaMember *)0x0) {
        (this_01->super_WebSocket)._vptr_WebSocket = (_func_int **)0x0;
        kj::_::PromiseDisposer::dispose(pPVar2);
      }
      kj::_::Coroutine<void>::fulfill(this_00,(FixVoid<void> *)((long)coroutine._M_fr_ptr + 0x5c1));
      *(undefined8 *)coroutine._M_fr_ptr = 0;
      *(undefined1 *)((long)coroutine._M_fr_ptr + 0x5c0) = 2;
    }
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> pumpTo(WebSocket& other) override {
      co_await inner->pumpTo(other);
      co_await afterReceiveClosed();
    }